

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O2

QMetaTypeInterface * interfaceForTypeNoWarning(int typeId)

{
  int iVar1;
  Type *pTVar2;
  QMetaTypeModuleHelper *pQVar3;
  undefined4 extraout_var;
  QMetaTypeInterface *pQVar4;
  long in_FS_OFFSET;
  QReadLocker local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (typeId < 0x10000) {
    pQVar3 = qModuleHelperForType(typeId);
    if (pQVar3 != (QMetaTypeModuleHelper *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        iVar1 = (**pQVar3->_vptr_QMetaTypeModuleHelper)
                          (pQVar3,typeId,*(long *)(in_FS_OFFSET + 0x28),
                           *pQVar3->_vptr_QMetaTypeModuleHelper);
        return (QMetaTypeInterface *)CONCAT44(extraout_var,iVar1);
      }
      goto LAB_0026fee8;
    }
LAB_0026febd:
    pQVar4 = (QMetaTypeInterface *)0x0;
  }
  else {
    if ((__atomic_base<signed_char>)
        QtGlobalStatic::
        Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>::guard.
        _q_value.super___atomic_base<signed_char>._M_i != -1) goto LAB_0026febd;
    pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
             ::instance();
    local_20.q_val = (quintptr)pTVar2;
    QReadLocker::relock(&local_20);
    if ((ulong)(long)(typeId + -0x10001) < (ulong)(pTVar2->registry).d.size) {
      pQVar4 = (pTVar2->registry).d.ptr[typeId + -0x10001];
    }
    else {
      pQVar4 = (QMetaTypeInterface *)0x0;
    }
    QReadLocker::~QReadLocker(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pQVar4;
  }
LAB_0026fee8:
  __stack_chk_fail();
}

Assistant:

static const QtPrivate::QMetaTypeInterface *interfaceForTypeNoWarning(int typeId)
{
    const QtPrivate::QMetaTypeInterface *iface = nullptr;
    if (typeId >= QMetaType::User) {
#ifndef QT_BOOTSTRAPPED
        if (customTypeRegistry.exists())
            iface = customTypeRegistry->getCustomType(typeId);
#endif
    } else {
        if (auto moduleHelper = qModuleHelperForType(typeId))
            iface = moduleHelper->interfaceForType(typeId);
    }
    return iface;
}